

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
             *this,char **it)

{
  uint uVar1;
  size_t __n;
  char *__dest;
  size_t __n_00;
  bool bVar2;
  byte *pbVar3;
  ulong uVar4;
  char *__s;
  char *pcVar5;
  size_t __len;
  unsigned_long __n2;
  
  __n = *(size_t *)(this + 8);
  __dest = *it;
  __s = __dest;
  if (__n != 0) {
    memmove(__dest,*(void **)this,__n);
    __s = __dest + __n;
    *it = __s;
  }
  __n_00 = *(size_t *)(this + 0x18);
  pcVar5 = __s;
  if (__n_00 != 0) {
    pcVar5 = __s + __n_00;
    memset(__s,*(int *)(this + 0x10),__n_00);
  }
  uVar1 = *(uint *)(this + 0x28);
  pbVar3 = (byte *)(__dest + __n_00 + __n + (ulong)uVar1);
  uVar4 = *(ulong *)(this + 0x20);
  do {
    pbVar3 = pbVar3 + -1;
    *pbVar3 = (byte)uVar4 & 7 | 0x30;
    bVar2 = 7 < uVar4;
    uVar4 = uVar4 >> 3;
  } while (bVar2);
  *it = pcVar5 + uVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = std::copy_n(prefix.data(), prefix.size(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }